

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  uInt uVar4;
  uint uVar5;
  Posf *pPVar6;
  Posf *pPVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  Bytef *pBVar14;
  uInt uVar15;
  uInt uVar16;
  bool bVar17;
  
LAB_00240216:
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar10 = s->lookahead;
      if (flush == 0 && uVar10 < 0x106) {
        return need_more;
      }
      if (uVar10 == 0) {
        uVar10 = s->strstart;
        uVar12 = 2;
        if (uVar10 < 2) {
          uVar12 = uVar10;
        }
        s->insert = uVar12;
        if (flush == 4) {
          uVar11 = s->block_start;
          if ((long)uVar11 < 0) {
            pBVar14 = (Bytef *)0x0;
          }
          else {
            pBVar14 = s->window + (uVar11 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar14,uVar10 - uVar11,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          uVar11 = s->block_start;
          if ((long)uVar11 < 0) {
            pBVar14 = (Bytef *)0x0;
          }
          else {
            pBVar14 = s->window + (uVar11 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar14,uVar10 - uVar11,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (2 < uVar10) goto LAB_00240254;
LAB_002402ad:
      uVar10 = s->match_length;
    }
    else {
LAB_00240254:
      uVar10 = s->strstart;
      uVar12 = ((uint)s->window[uVar10 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar12;
      pPVar6 = s->head;
      uVar1 = pPVar6[uVar12];
      s->prev[s->w_mask & uVar10] = uVar1;
      pPVar6[uVar12] = (Posf)uVar10;
      uVar12 = (uint)uVar1;
      if ((uVar12 == 0) || (s->w_size - 0x106 < uVar10 - uVar12)) goto LAB_002402ad;
      uVar10 = longest_match(s,uVar12);
      s->match_length = uVar10;
    }
    if (uVar10 < 3) {
      bVar9 = s->window[s->strstart];
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = '\0';
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = '\0';
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = bVar9;
      s->dyn_ltree[bVar9].fc.freq = s->dyn_ltree[bVar9].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      uVar10 = s->strstart + 1;
      uVar11 = (ulong)uVar10;
      s->strstart = uVar10;
      if (s->sym_next != s->sym_end) goto LAB_00240216;
    }
    else {
      bVar9 = (char)uVar10 - 3;
      iVar13 = s->strstart - s->match_start;
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = (uchf)iVar13;
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = (uchf)((uint)iVar13 >> 8);
      uVar10 = s->sym_next;
      s->sym_next = uVar10 + 1;
      s->sym_buf[uVar10] = bVar9;
      s->dyn_ltree[(ulong)""[bVar9] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar9] + 0x101].fc.freq + 1;
      uVar12 = iVar13 - 1U & 0xffff;
      uVar10 = (uVar12 >> 7) + 0x100;
      if (uVar12 < 0x100) {
        uVar10 = iVar13 - 1U;
      }
      s->dyn_dtree[""[uVar10 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar10 & 0xffff]].fc.freq + 1;
      uVar2 = s->sym_next;
      uVar3 = s->sym_end;
      uVar10 = s->match_length;
      uVar12 = s->lookahead - uVar10;
      s->lookahead = uVar12;
      if (uVar12 < 3 || s->max_lazy_match < uVar10) {
        uVar4 = s->strstart;
        uVar12 = uVar4 + uVar10;
        uVar11 = (ulong)uVar12;
        s->strstart = uVar12;
        s->match_length = 0;
        uVar12 = (uint)s->window[uVar11];
        s->ins_h = uVar12;
        s->ins_h = ((uint)s->window[uVar4 + uVar10 + 1] ^ uVar12 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar10 - 1;
        uVar4 = s->hash_shift;
        pBVar14 = s->window;
        uVar12 = s->hash_mask;
        pPVar6 = s->head;
        pPVar7 = s->prev;
        uVar5 = s->w_mask;
        uVar16 = s->ins_h;
        uVar15 = uVar10 - 2;
        uVar11 = (ulong)(s->strstart + 1);
        do {
          uVar10 = (uint)uVar11;
          s->strstart = uVar10;
          uVar16 = ((uint)pBVar14[uVar10 + 2] ^ uVar16 << ((byte)uVar4 & 0x1f)) & uVar12;
          s->ins_h = uVar16;
          pPVar7[uVar5 & uVar10] = pPVar6[uVar16];
          pPVar6[uVar16] = (Posf)uVar11;
          s->match_length = uVar15;
          uVar11 = (ulong)(uVar10 + 1);
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        s->strstart = uVar10 + 1;
      }
      if (uVar2 != uVar3) goto LAB_00240216;
    }
    uVar8 = s->block_start;
    if ((long)uVar8 < 0) {
      pBVar14 = (Bytef *)0x0;
    }
    else {
      pBVar14 = s->window + (uVar8 & 0xffffffff);
    }
    cm_zlib__tr_flush_block(s,(charf *)pBVar14,uVar11 - uVar8,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(deflate_state *s, int flush) {
    IPos hash_head;       /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart + 2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart + 1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit(s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}